

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx)

{
  char *pcVar1;
  size_t sVar2;
  pointer pcVar3;
  Variant *pVVar4;
  StorageClass SVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint type_id;
  size_type sVar13;
  long *plVar14;
  SPIRType *pSVar15;
  undefined8 *puVar16;
  size_type sVar17;
  mapped_type *pmVar18;
  SPIRType *pSVar19;
  ulong uVar20;
  SPIRConstant *pSVar21;
  ID **ppIVar22;
  size_type *psVar23;
  Vector<std::function<void_()>_> *this_00;
  CompilerMSL *this_01;
  undefined1 auVar24 [8];
  ID *pIVar25;
  char (*ts_2) [2];
  byte bVar26;
  byte bVar27;
  BuiltIn builtin;
  uint32_t orig_mbr_type_id;
  string var_chain;
  string qual_var_name;
  string mbr_name;
  bool local_2b1;
  bool local_2af;
  bool local_2ad;
  BuiltIn local_2ac;
  CompilerMSL *local_2a8;
  StorageClass local_29c;
  size_t local_298;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_290;
  SPIRType *local_288;
  uint local_27c;
  _Any_data local_278;
  ID *local_268;
  code *pcStack_260;
  string local_258;
  string local_238;
  SPIRFunction *local_218;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_210;
  undefined1 local_208 [8];
  CompilerMSL *pCStack_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [8];
  ID aIStack_1e8 [2];
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [8];
  Variant *pVStack_1c8;
  ID *pIStack_1c0;
  Variant local_1b8;
  SmallVector<bool,_8UL> local_198;
  ID *local_178;
  uint32_t uStack_170;
  uint32_t uStack_16c;
  uint32_t uStack_168;
  char acStack_164 [12];
  undefined1 local_158 [56];
  SmallVector<unsigned_int,_8UL> local_120;
  TypeID local_e8;
  Dim DStack_e4;
  undefined4 uStack_e0;
  uint32_t uStack_dc;
  float local_d8;
  AccessQualifier AStack_d4;
  TypeID TStack_d0;
  TypeID TStack_cc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_c8;
  string local_90;
  string local_70;
  string local_50;
  
  local_2a8 = (CompilerMSL *)var;
  local_29c = storage;
  local_218 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_2ac = BuiltInMax;
  bVar6 = Compiler::is_member_builtin((Compiler *)this,var_type,mbr_idx,&local_2ac);
  bVar7 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationFlat);
  local_2b1 = true;
  local_2ad = true;
  if (!bVar7) {
    local_2ad = Compiler::has_decoration
                          ((Compiler *)this,
                           (ID)*(uint32_t *)
                                &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                                 super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                                 _M_head_impl,DecorationFlat);
  }
  bVar7 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationNoPerspective);
  if (!bVar7) {
    local_2b1 = Compiler::has_decoration
                          ((Compiler *)this,
                           (ID)*(uint32_t *)
                                &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                                 super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                                 _M_head_impl,DecorationNoPerspective);
  }
  bVar7 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,Centroid);
  local_2af = true;
  bVar8 = true;
  if (!bVar7) {
    bVar8 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)*(uint32_t *)
                            &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                             super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                             _M_head_impl,Centroid);
  }
  bVar7 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationSample);
  if (!bVar7) {
    local_2af = Compiler::has_decoration
                          ((Compiler *)this,
                           (ID)*(uint32_t *)
                                &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                                 super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                                 _M_head_impl,DecorationSample);
  }
  local_210 = &ib_type->member_types;
  local_298 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
  local_288 = ib_type;
  uVar11 = ensure_correct_builtin_type
                     (this,(var_type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                           [mbr_idx].id,local_2ac);
  (var_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
  [mbr_idx].id = uVar11;
  uVar12 = uVar11;
  if (local_29c == Input) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (sVar13 != 0) {
      uVar12 = build_msl_interpolant_type(this,uVar11,local_2b1);
    }
  }
  pSVar15 = local_288;
  local_27c = uVar11;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
            (local_210,
             (local_288->member_types).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size + 1);
  sVar2 = (pSVar15->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  (pSVar15->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar2].
  id = uVar12;
  (pSVar15->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
       = sVar2 + 1;
  ts_2 = (char (*) [2])(ulong)mbr_idx;
  append_member_name(&local_50,this,mbr_name_qual,var_type,mbr_idx);
  this_01 = (CompilerMSL *)0x38d2ad;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"m","");
  ensure_valid_name(&local_90,this_01,&local_50,&local_70);
  SVar5 = local_29c;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  Compiler::set_member_name
            ((Compiler *)this,(TypeID)(local_288->super_IVariant).self.id,(uint32_t)local_298,
             &local_90);
  local_208 = (undefined1  [8])local_1f8;
  pcVar3 = (ib_var_ref->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,pcVar3,pcVar3 + ib_var_ref->_M_string_length);
  ::std::__cxx11::string::append(local_208);
  plVar14 = (long *)::std::__cxx11::string::_M_append(local_208,(ulong)local_90._M_dataplus._M_p);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  psVar23 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_238.field_2._M_allocated_capacity = *psVar23;
    local_238.field_2._8_8_ = plVar14[3];
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar23;
    local_238._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_238._M_string_length = plVar14[1];
  *plVar14 = (long)psVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208);
  }
  if (SVar5 == Input) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (sVar13 != 0) {
      if (local_2af == true && bVar8 == false) {
        CompilerGLSL::to_expression_abi_cxx11_
                  (&local_258,&this->super_CompilerGLSL,this->builtin_sample_id_id,true);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  ((string *)local_208,(spirv_cross *)".interpolate_at_sample(",
                   (char (*) [24])&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b224b,
                   ts_2);
        ::std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_208);
        if (local_208 != (undefined1  [8])local_1f8) {
          operator_delete((void *)local_208);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
      }
      else {
        ::std::__cxx11::string::append((char *)&local_238);
      }
    }
  }
  bVar7 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationLocation);
  bVar9 = Compiler::has_decoration
                    ((Compiler *)this,
                     (ID)*(uint32_t *)
                          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                           _M_head_impl,DecorationLocation);
  if (bVar7) {
    uVar12 = Compiler::get_member_decoration
                       ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                        DecorationLocation);
  }
  else if (bVar9) {
    uVar12 = CompilerGLSL::get_accumulated_member_location
                       (&this->super_CompilerGLSL,(SPIRVariable *)local_2a8,mbr_idx,
                        meta->strip_array);
  }
  else {
    uVar12 = 0xffffffff;
    if (bVar6) {
      bVar10 = Compiler::is_tessellation_shader((Compiler *)this);
      if (bVar10 && SVar5 == Input) {
        local_290 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->inputs_by_builtin;
        local_208._0_4_ = local_2ac;
        sVar17 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_290,(key_type *)local_208);
        if (sVar17 == 0) goto LAB_0022f608;
        local_208._0_4_ = local_2ac;
        pmVar18 = ::std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_290,(key_type *)local_208);
LAB_0022f65f:
        uVar12 = pmVar18->location;
      }
      else {
LAB_0022f608:
        if ((SVar5 == Output) && (this->capture_output_to_buffer != false)) {
          local_290 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->outputs_by_builtin;
          local_208._0_4_ = local_2ac;
          sVar17 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)local_290,(key_type *)local_208);
          if (sVar17 != 0) {
            local_208._0_4_ = local_2ac;
            pmVar18 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_290,(key_type *)local_208);
            goto LAB_0022f65f;
          }
        }
      }
    }
  }
  if ((*location == 0xffffffff) && (uVar12 != 0xffffffff)) {
    *location = uVar12;
  }
  local_290 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)CONCAT44(local_290._4_4_,uVar12);
  uVar12 = 0xffffffff;
  pSVar15 = local_288;
  type_id = local_27c;
  if ((bVar9 || bVar7) && SVar5 == Input) {
    uVar12 = 0;
    if (bVar7) {
      uVar12 = Compiler::get_member_decoration
                         ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                          Component);
    }
    type_id = ensure_correct_input_type(this,local_27c,*location,uVar12,0,meta->strip_array);
    uVar12 = 0xffffffff;
    if (type_id != local_27c) {
      pSVar15 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + local_27c);
      uVar12 = pSVar15->vecsize;
    }
    local_208._0_4_ =
         *(undefined4 *)
          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    pSVar15 = local_288;
    uVar11 = type_id;
    if (sVar13 != 0) {
      uVar11 = build_msl_interpolant_type(this,type_id,local_2b1);
    }
    (local_210->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
    [local_298 & 0xffffffff].id = uVar11;
  }
  pcVar3 = (var_chain_qual->_M_dataplus)._M_p;
  local_208 = (undefined1  [8])local_1f8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,pcVar3,pcVar3 + var_chain_qual->_M_string_length);
  ::std::__cxx11::string::append(local_208);
  CompilerGLSL::to_member_name_abi_cxx11_
            ((string *)&local_278,&this->super_CompilerGLSL,var_type,mbr_idx);
  pcVar1 = (pCStack_200->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
           local_278._8_8_ + -0x40;
  auVar24 = (undefined1  [8])(ID *)0xf;
  if (local_208 != (undefined1  [8])local_1f8) {
    auVar24 = local_1f8;
  }
  if ((ulong)auVar24 < pcVar1) {
    pIVar25 = (ID *)0xf;
    if ((ID **)local_278._M_unused._0_8_ != &local_268) {
      pIVar25 = local_268;
    }
    if (pIVar25 < pcVar1) goto LAB_0022f3e8;
    puVar16 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_208);
  }
  else {
LAB_0022f3e8:
    puVar16 = (undefined8 *)
              ::std::__cxx11::string::_M_append(local_208,local_278._M_unused._M_member_pointer);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar23 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_258.field_2._M_allocated_capacity = *psVar23;
    local_258.field_2._8_8_ = puVar16[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar23;
    local_258._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_258._M_string_length = puVar16[1];
  *puVar16 = psVar23;
  puVar16[1] = 0;
  *(undefined1 *)psVar23 = 0;
  if ((ID **)local_278._M_unused._0_8_ != &local_268) {
    operator_delete(local_278._M_unused._M_object);
  }
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208);
  }
  if ((bVar6) && (meta->strip_array == false)) {
    bVar27 = 1;
    Compiler::set_member_qualified_name
              ((Compiler *)this,(var_type->super_IVariant).self.id,mbr_idx,&local_238);
    uVar12 = (uint32_t)local_290;
  }
  else {
    bVar26 = 1;
    bVar27 = 1;
    uStack_1e0 = (ID *)CONCAT44(uStack_1e0._4_4_,(BaseType)uStack_1e0);
    if ((meta->strip_array == false) &&
       (uStack_1e0 = (ID *)CONCAT44(uStack_1e0._4_4_,(BaseType)uStack_1e0),
       meta->allow_local_declaration == true)) {
      if (local_29c == Output) {
        local_208 = (undefined1  [8])this;
        pCStack_200 = (CompilerMSL *)local_1f0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&pCStack_200,local_238._M_dataplus._M_p,
                   local_238._M_dataplus._M_p + local_238._M_string_length);
        uStack_1e0 = (ID *)local_1d0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&uStack_1e0,local_258._M_dataplus._M_p,
                   local_258._M_dataplus._M_p + local_258._M_string_length);
        local_268 = (ID *)0x0;
        pcStack_260 = (code *)0x0;
        local_278._M_unused._M_object = (void *)0x0;
        local_278._8_8_ = 0;
        local_278._M_unused._M_object = operator_new(0x48);
        *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_208;
        *(ID **)((long)local_278._M_unused._0_8_ + 8) =
             (ID *)((long)local_278._M_unused._0_8_ + 0x18);
        if (pCStack_200 == (CompilerMSL *)local_1f0) {
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
          *(ID **)((long)local_278._M_unused._0_8_ + 0x20) =
               (ID *)CONCAT44(aIStack_1e8[1].id,aIStack_1e8[0].id);
        }
        else {
          *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_200;
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
        }
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f8;
        local_1f8 = (undefined1  [8])0x0;
        local_1f0 = (undefined1  [8])((ulong)local_1f0 & 0xffffffffffffff00);
        *(ID **)((long)local_278._M_unused._0_8_ + 0x28) =
             (ID *)((long)local_278._M_unused._0_8_ + 0x38);
        if (uStack_1e0 == (ID *)local_1d0) {
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x38) = local_1d0;
          *(Variant **)((long)local_278._M_unused._0_8_ + 0x40) = pVStack_1c8;
        }
        else {
          *(ID **)((long)local_278._M_unused._0_8_ + 0x28) = uStack_1e0;
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x38) = local_1d0;
        }
        *(ID **)((long)local_278._M_unused._0_8_ + 0x30) =
             (ID *)CONCAT44(local_1d8._4_4_,(uint32_t)local_1d8);
        local_1d8._0_4_ = 0;
        local_1d8._4_4_ = 0;
        local_1d0 = (undefined1  [8])((ulong)local_1d0 & 0xffffffffffffff00);
        pcStack_260 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3445:41)>
                      ::_M_invoke;
        local_268 = (ID *)::std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3445:41)>
                          ::_M_manager;
        pCStack_200 = (CompilerMSL *)local_1f0;
        uStack_1e0 = (ID *)local_1d0;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&local_218->fixup_hooks_out,(function<void_()> *)&local_278);
        if (local_268 != (ID *)0x0) {
          (*(code *)local_268)(&local_278,&local_278,3);
        }
        pSVar15 = local_288;
        if (uStack_1e0 != (ID *)local_1d0) {
          operator_delete(uStack_1e0);
        }
        if (pCStack_200 != (CompilerMSL *)local_1f0) {
          operator_delete(pCStack_200);
        }
        bVar26 = 0;
      }
      else {
        uStack_1e0 = (ID *)CONCAT44(uStack_1e0._4_4_,(BaseType)uStack_1e0);
        if (local_29c == Input) {
          local_208._0_4_ = uVar12;
          pCStack_200 = this;
          local_1f8 = (undefined1  [8])aIStack_1e8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1f8,local_258._M_dataplus._M_p,
                     local_258._M_dataplus._M_p + local_258._M_string_length);
          local_1d8 = (ID *)(local_1d0 + 8);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_238._M_dataplus._M_p,
                     local_238._M_dataplus._M_p + local_238._M_string_length);
          local_268 = (ID *)0x0;
          pcStack_260 = (code *)0x0;
          local_278._M_unused._M_object = (void *)0x0;
          local_278._8_8_ = 0;
          local_278._M_unused._M_object = operator_new(0x50);
          *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_208;
          *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_200;
          *(ID **)((long)local_278._M_unused._0_8_ + 0x10) =
               (ID *)((long)local_278._M_unused._0_8_ + 0x20);
          if (local_1f8 == (undefined1  [8])aIStack_1e8) {
            *(ID **)((long)local_278._M_unused._0_8_ + 0x20) =
                 (ID *)CONCAT44(aIStack_1e8[1].id,aIStack_1e8[0].id);
            *(ID **)((long)local_278._M_unused._0_8_ + 0x28) =
                 (ID *)CONCAT44(uStack_1e0._4_4_,(BaseType)uStack_1e0);
          }
          else {
            *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f8;
            *(ID **)((long)local_278._M_unused._0_8_ + 0x20) =
                 (ID *)CONCAT44(aIStack_1e8[1].id,aIStack_1e8[0].id);
          }
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
          local_1f0 = (undefined1  [8])0x0;
          aIStack_1e8[0].id = aIStack_1e8[0].id & 0xffffff00;
          *(ID **)((long)local_278._M_unused._0_8_ + 0x30) =
               (ID *)((long)local_278._M_unused._0_8_ + 0x40);
          if (local_1d8 == (ID *)(local_1d0 + 8)) {
            *(Variant **)((long)local_278._M_unused._0_8_ + 0x40) = pVStack_1c8;
            *(ID **)((long)local_278._M_unused._0_8_ + 0x48) = pIStack_1c0;
          }
          else {
            *(ID **)((long)local_278._M_unused._0_8_ + 0x30) = local_1d8;
            *(Variant **)((long)local_278._M_unused._0_8_ + 0x40) = pVStack_1c8;
          }
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x38) = local_1d0;
          local_1d0 = (undefined1  [8])0x0;
          pVStack_1c8 = (Variant *)((ulong)pVStack_1c8 & 0xffffffffffffff00);
          pcStack_260 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3434:40)>
                        ::_M_invoke;
          local_268 = (ID *)::std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3434:40)>
                            ::_M_manager;
          local_1f8 = (undefined1  [8])aIStack_1e8;
          local_1d8 = (ID *)(local_1d0 + 8);
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (&local_218->fixup_hooks_in,(function<void_()> *)&local_278);
          if (local_268 != (ID *)0x0) {
            (*(code *)local_268)(&local_278,&local_278,3);
          }
          pSVar15 = local_288;
          if (local_1d8 != (ID *)(local_1d0 + 8)) {
            operator_delete(local_1d8);
          }
          uVar12 = (uint32_t)local_290;
          if (local_1f8 != (undefined1  [8])aIStack_1e8) {
            operator_delete((void *)local_1f8);
          }
          goto LAB_0022f92f;
        }
      }
    }
    bVar27 = bVar26;
    uVar12 = (uint32_t)local_290;
  }
LAB_0022f92f:
  if (!bVar6) {
    uVar12 = *location;
  }
  if (uVar12 != 0xffffffff) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
               DecorationLocation,*location);
    uVar12 = *location;
    pSVar19 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + type_id);
    mark_location_as_used_by_shader(this,uVar12,pSVar19,local_29c,false);
    pSVar19 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + type_id);
    uVar12 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar19);
    *location = *location + uVar12;
  }
  bVar7 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,Component);
  if (bVar7) {
    uVar12 = Compiler::get_member_decoration
                       ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                        Component);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
               Component,uVar12);
  }
  if (bVar6) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
               BuiltIn,local_2ac);
    if ((local_29c == Output) && (local_2ac == BuiltInPosition)) {
      ::std::__cxx11::string::_M_assign((string *)&this->qual_pos_var_name);
    }
  }
  if (((bool)(bVar27 & *(int *)&(local_2a8->super_CompilerGLSL).super_Compiler.ir.spirv.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start == 3)) &&
     (uVar20 = (ulong)*(uint *)((long)&(local_2a8->super_CompilerGLSL).super_Compiler.ir.spirv.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8), uVar20 != 0)) {
    if ((uVar20 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar20].type == TypeConstant)) {
      pSVar21 = Variant::get<spirv_cross::SPIRConstant>(pVVar4 + uVar20);
    }
    else {
      pSVar21 = (SPIRConstant *)0x0;
    }
    if (pSVar21 != (SPIRConstant *)0x0) {
      this_00 = &local_218->fixup_hooks_in;
      if (meta->strip_array == true) {
        local_208 = (undefined1  [8])local_2a8;
        local_1f8._0_4_ = mbr_idx;
        pCStack_200 = this;
        SPIRType::SPIRType((SPIRType *)local_1f0,pSVar15);
        local_268 = (ID *)0x0;
        pcStack_260 = (code *)0x0;
        local_278._M_unused._M_object = (void *)0x0;
        local_278._8_8_ = 0;
        ppIVar22 = (ID **)operator_new(0x178);
        *(undefined4 *)(ppIVar22 + 2) = local_1f8._0_4_;
        *ppIVar22 = (ID *)local_208;
        ppIVar22[1] = (ID *)pCStack_200;
        ppIVar22[3] = (ID *)&PTR__IVariant_0049df28;
        *(uint32_t *)(ppIVar22 + 4) = aIStack_1e8[0].id;
        ppIVar22[3] = (ID *)&PTR__SPIRType_0049ded8;
        *(ulong *)((long)ppIVar22 + 0x24) = CONCAT44((BaseType)uStack_1e0,aIStack_1e8[1].id);
        *(ulong *)((long)ppIVar22 + 0x2c) = CONCAT44((uint32_t)local_1d8,uStack_1e0._4_4_);
        *(uint32_t *)((long)ppIVar22 + 0x34) = local_1d8._4_4_;
        ppIVar22[7] = (ID *)0x0;
        ppIVar22[8] = (ID *)0x0;
        ppIVar22[7] = (ID *)(ppIVar22 + 10);
        ppIVar22[9] = (ID *)0x8;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(ppIVar22 + 7),
                   (SmallVector<unsigned_int,_8UL> *)local_1d0);
        ppIVar22[0xe] = (ID *)0x0;
        ppIVar22[0xf] = (ID *)0x0;
        ppIVar22[0xe] = (ID *)(ppIVar22 + 0x11);
        ppIVar22[0x10] = (ID *)0x8;
        SmallVector<bool,_8UL>::operator=((SmallVector<bool,_8UL> *)(ppIVar22 + 0xe),&local_198);
        ppIVar22[0x12] = local_178;
        ppIVar22[0x13] = (ID *)CONCAT44(uStack_16c,uStack_170);
        *(ulong *)((long)ppIVar22 + 0x9c) = CONCAT44(uStack_168,uStack_16c);
        *(undefined8 *)((long)ppIVar22 + 0xa4) = acStack_164._0_8_;
        ppIVar22[0x16] = (ID *)0x0;
        ppIVar22[0x17] = (ID *)0x0;
        ppIVar22[0x16] = (ID *)(ppIVar22 + 0x19);
        ppIVar22[0x18] = (ID *)0x8;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   (ppIVar22 + 0x16),
                   (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_158);
        ppIVar22[0x1d] = (ID *)0x0;
        ppIVar22[0x1e] = (ID *)0x0;
        ppIVar22[0x1d] = (ID *)(ppIVar22 + 0x20);
        ppIVar22[0x1f] = (ID *)0x8;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(ppIVar22 + 0x1d),&local_120);
        *(uint32_t *)(ppIVar22 + 0x24) = local_e8.id;
        *(Dim *)((long)ppIVar22 + 0x124) = DStack_e4;
        *(undefined4 *)(ppIVar22 + 0x25) = uStack_e0;
        *(uint32_t *)((long)ppIVar22 + 300) = uStack_dc;
        *(float *)(ppIVar22 + 0x26) = local_d8;
        *(AccessQualifier *)((long)ppIVar22 + 0x134) = AStack_d4;
        *(uint32_t *)(ppIVar22 + 0x27) = TStack_d0.id;
        *(uint32_t *)((long)ppIVar22 + 0x13c) = TStack_cc.id;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)(ppIVar22 + 0x28),&_Stack_c8,&_Stack_c8);
        pcStack_260 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3483:40)>
                      ::_M_invoke;
        local_268 = (ID *)::std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3483:40)>
                          ::_M_manager;
        local_278._M_unused._0_8_ = ppIVar22;
        SmallVector<std::function<void_()>,_0UL>::push_back(this_00,(function<void_()> *)&local_278)
        ;
        if (local_268 != (ID *)0x0) {
          (*(code *)local_268)(&local_278,&local_278,3);
        }
        local_1f0 = (undefined1  [8])&PTR__SPIRType_0049ded8;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&_Stack_c8);
        local_120.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_120.super_VectorView<unsigned_int>.ptr !=
            &local_120.stack_storage) {
          free(local_120.super_VectorView<unsigned_int>.ptr);
        }
        pSVar15 = local_288;
        local_158._8_8_ = 0;
        if ((TypedID<(spirv_cross::Types)1> *)local_158._0_8_ !=
            (TypedID<(spirv_cross::Types)1> *)(local_158 + 0x18)) {
          free((void *)local_158._0_8_);
        }
        local_198.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)local_198.super_VectorView<bool>.ptr !=
            &local_198.stack_storage) {
          free(local_198.super_VectorView<bool>.ptr);
        }
        pVStack_1c8 = (Variant *)0x0;
        if (local_1d0 != (undefined1  [8])(local_1d0 + 0x18)) {
          free((void *)local_1d0);
        }
      }
      else {
        local_208 = (undefined1  [8])this;
        pCStack_200 = (CompilerMSL *)local_1f0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&pCStack_200,local_238._M_dataplus._M_p,
                   local_238._M_dataplus._M_p + local_238._M_string_length);
        uStack_1e0._0_4_ = (BaseType)pSVar21;
        uStack_1e0._4_4_ = (uint32_t)((ulong)pSVar21 >> 0x20);
        local_1d8._0_4_ = mbr_idx;
        local_278._M_unused._M_object = (void *)0x0;
        local_278._8_8_ = 0;
        local_268 = (ID *)0x0;
        pcStack_260 = (code *)0x0;
        local_278._M_unused._M_object = operator_new(0x38);
        *(undefined1 (*) [8])local_278._M_unused._0_8_ = local_208;
        *(ID **)((long)local_278._M_unused._0_8_ + 8) =
             (ID *)((long)local_278._M_unused._0_8_ + 0x18);
        if (pCStack_200 == (CompilerMSL *)local_1f0) {
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
          *(ID **)((long)local_278._M_unused._0_8_ + 0x20) =
               (ID *)CONCAT44(aIStack_1e8[1].id,aIStack_1e8[0].id);
        }
        else {
          *(CompilerMSL **)((long)local_278._M_unused._0_8_ + 8) = pCStack_200;
          *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x18) = local_1f0;
        }
        *(undefined1 (*) [8])((long)local_278._M_unused._0_8_ + 0x10) = local_1f8;
        local_1f8 = (undefined1  [8])0x0;
        local_1f0 = (undefined1  [8])((ulong)local_1f0 & 0xffffffffffffff00);
        *(uint32_t *)((long)local_278._M_unused._0_8_ + 0x30) = (uint32_t)local_1d8;
        *(ID **)((long)local_278._M_unused._0_8_ + 0x28) =
             (ID *)CONCAT44(uStack_1e0._4_4_,(BaseType)uStack_1e0);
        pcStack_260 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3497:40)>
                      ::_M_invoke;
        local_268 = (ID *)::std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3497:40)>
                          ::_M_manager;
        pCStack_200 = (CompilerMSL *)local_1f0;
        SmallVector<std::function<void_()>,_0UL>::push_back(this_00,(function<void_()> *)&local_278)
        ;
        if (local_268 != (ID *)0x0) {
          (*(code *)local_268)(&local_278,&local_278,3);
        }
        pSVar15 = local_288;
        if (pCStack_200 != (CompilerMSL *)local_1f0) {
          operator_delete(pCStack_200);
        }
      }
    }
  }
  if (local_29c == Input) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (sVar13 != 0) goto LAB_0022ff17;
  }
  if (local_2ad != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
               DecorationFlat,0);
  }
  if (local_2b1 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
               DecorationNoPerspective,0);
  }
  if (bVar8 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
               Centroid,0);
  }
  if (local_2af != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
               DecorationSample,0);
  }
LAB_0022ff17:
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
             SPIRVCrossDecorationInterfaceOrigID,
             *(uint32_t *)
              &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(pSVar15->super_IVariant).self.id,(uint32_t)local_298,
             SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::add_plain_member_variable_to_interface_block(StorageClass storage,
                                                               const string &ib_var_ref, SPIRType &ib_type,
                                                               SPIRVariable &var, SPIRType &var_type,
                                                               uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                               const string &mbr_name_qual,
                                                               const string &var_chain_qual,
                                                               uint32_t &location, uint32_t &var_mbr_idx)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat =
	    has_member_decoration(var_type.self, mbr_idx, DecorationFlat) || has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample =
	    has_member_decoration(var_type.self, mbr_idx, DecorationSample) || has_decoration(var.self, DecorationSample);

	// Add a reference to the member to the interface struct.
	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	mbr_type_id = ensure_correct_builtin_type(mbr_type_id, builtin);
	var_type.member_types[mbr_idx] = mbr_type_id;
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(mbr_type_id, is_noperspective));
	else
		ib_type.member_types.push_back(mbr_type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	// The SPIRV location of interface variable, used to obtain the initial
	// MSL location (the location variable) and interface matching
	uint32_t ir_location = UINT32_MAX;
	bool has_member_loc_decor = has_member_decoration(var_type.self, mbr_idx, DecorationLocation);
	bool has_var_loc_decor = has_decoration(var.self, DecorationLocation);
	uint32_t orig_vecsize = UINT32_MAX;

	if (has_member_loc_decor)
		ir_location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation);
	else if (has_var_loc_decor)
		ir_location = get_accumulated_member_location(var, mbr_idx, meta.strip_array);
	else if (is_builtin)
	{
		if (is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
			ir_location = inputs_by_builtin[builtin].location;
		else if (capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
			ir_location = outputs_by_builtin[builtin].location;
	}

	// Once we determine the location of the first member within nested structures,
	// from a var of the topmost structure, the remaining flattened members of
	// the nested structures will have consecutive location values. At this point,
	// we've recursively tunnelled into structs, arrays, and matrices, and are
	// down to a single location for each member now.
	if (location == UINT32_MAX && ir_location != UINT32_MAX)
		location = ir_location;

	if (storage == StorageClassInput && (has_member_loc_decor || has_var_loc_decor))
	{
		uint32_t component = 0;
		uint32_t orig_mbr_type_id = mbr_type_id;

		if (has_member_loc_decor)
			component = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);

		mbr_type_id = ensure_correct_input_type(mbr_type_id, location, component, 0, meta.strip_array);

		// For members of the composite interface block, we only change the interface block type
		// when interface matching happens. In the meantime, we store the original vector size
		// and insert a swizzle when loading from metal interface block (see fixup below)
		if (mbr_type_id != orig_mbr_type_id)
			orig_vecsize = get<SPIRType>(orig_mbr_type_id).vecsize;

		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
		else
			ib_type.member_types[ib_mbr_idx] = mbr_type_id;
	}

	bool flatten_stage_out = false;
	string var_chain = var_chain_qual + "." + to_member_name(var_type, mbr_idx);
	if (is_builtin && !meta.strip_array)
	{
		// For the builtin gl_PerVertex, we cannot treat it as a block anyways,
		// so redirect to qualified name.
		set_member_qualified_name(var_type.self, mbr_idx, qual_var_name);
	}
	else if (!meta.strip_array && meta.allow_local_declaration)
	{
		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		switch (storage)
		{
		case StorageClassInput:
			entry_func.fixup_hooks_in.push_back([=]() {
				string swizzle;
				// Insert swizzle for widened interface block vector from interface matching
				if (orig_vecsize != UINT32_MAX)
					swizzle = vector_swizzle(orig_vecsize, 0);
				statement(var_chain, " = ", qual_var_name, swizzle, ";");
			});
			break;

		case StorageClassOutput:
			flatten_stage_out = true;
			entry_func.fixup_hooks_out.push_back([=]() {
				statement(qual_var_name, " = ", var_chain, ";");
			});
			break;

		default:
			break;
		}
	}

	if ((!is_builtin && location != UINT32_MAX) || (is_builtin && ir_location != UINT32_MAX))
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}

	// Copy the component location, if present.
	if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
	{
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	const SPIRConstant *c = nullptr;
	if (!flatten_stage_out && var.storage == StorageClassOutput &&
	    var.initializer != ID(0) && (c = maybe_get<SPIRConstant>(var.initializer)))
	{
		if (meta.strip_array)
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				auto &type = this->get<SPIRType>(var.basetype);
				uint32_t index = get_extended_member_decoration(var.self, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex);

				auto invocation = to_tesc_invocation_id();
				auto constant_chain = join(to_expression(var.initializer), "[", invocation, "]");
				statement(to_expression(stage_out_ptr_var_id), "[",
				          invocation, "].",
				          to_member_name(ib_type, index), " = ",
				          constant_chain, ".", to_member_name(type, mbr_idx), ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(qual_var_name, " = ", constant_expression(
						this->get<SPIRConstant>(c->subconstants[mbr_idx])), ";");
			});
		}
	}

	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);
}